

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example3.cpp
# Opt level: O3

int main(void)

{
  double dVar1;
  double dVar2;
  double dVar3;
  Scene *this;
  GeometricObject *this_00;
  GeometricObject *this_01;
  GeometricObject *this_02;
  GeometricObject *this_03;
  undefined8 *puVar4;
  SolidPtrList *this_04;
  Vector local_98;
  vector<std::shared_ptr<LightSource>,std::allocator<std::shared_ptr<LightSource>>> *local_80;
  undefined4 local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  Vector local_68;
  Vector local_48;
  
  this = (Scene *)operator_new(0xe8);
  this->_vptr_Scene = (_func_int **)&PTR__Scene_00108b50;
  (this->light).
  super__Vector_base<std::shared_ptr<LightSource>,_std::allocator<std::shared_ptr<LightSource>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->light).
  super__Vector_base<std::shared_ptr<LightSource>,_std::allocator<std::shared_ptr<LightSource>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->light).
  super__Vector_base<std::shared_ptr<LightSource>,_std::allocator<std::shared_ptr<LightSource>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->solid).
  super__Vector_base<std::shared_ptr<GeometricObject>,_std::allocator<std::shared_ptr<GeometricObject>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->solid).
  super__Vector_base<std::shared_ptr<GeometricObject>,_std::allocator<std::shared_ptr<GeometricObject>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->solid).
  super__Vector_base<std::shared_ptr<GeometricObject>,_std::allocator<std::shared_ptr<GeometricObject>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->envFog).super___shared_ptr<Fog,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->envFog).super___shared_ptr<Fog,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->eye).x = 0.0;
  (this->eye).y = 0.0;
  (this->eye).z = 0.0;
  (this->eye_dir).x = 0.0;
  (this->eye_dir).y = 0.0;
  (this->eye_dir).z = 1.0;
  (this->view_x).x = 1.0;
  (this->view_x).y = 0.0;
  (this->view_x).z = 0.0;
  (this->view_y).x = 0.0;
  (this->view_y).y = 1.0;
  (this->view_y).z = 0.0;
  this->aperture = 0.0;
  this->focus = 0.0;
  (this->ambient).x = 1.0;
  (this->ambient).y = 1.0;
  (this->ambient).z = 1.0;
  (this->background).x = 0.0;
  (this->background).y = 0.05;
  (this->background).z = 0.05;
  this_00 = (GeometricObject *)operator_new(200);
  GeometricObject::GeometricObject(this_00);
  this_00->_vptr_GeometricObject = (_func_int **)&PTR__GeometricObject_00108c18;
  *(undefined4 *)&this_00[1]._vptr_GeometricObject = 0;
  *(undefined4 *)((long)&this_00[1]._vptr_GeometricObject + 4) = 0;
  *(undefined4 *)&this_00[1].def_material.ka = 0;
  *(undefined4 *)((long)&this_00[1].def_material.ka + 4) = 0x3ff00000;
  this_00[1].def_material.kd = 5.0;
  this_00[1].def_material.ks = 1.5;
  this_00[1].def_material.kr = 2.25;
  this_01 = (GeometricObject *)operator_new(200);
  GeometricObject::GeometricObject(this_01);
  this_01->_vptr_GeometricObject = (_func_int **)&PTR__GeometricObject_00108c18;
  this_01[1]._vptr_GeometricObject = (_func_int **)0xc008000000000000;
  this_01[1].def_material.ka = 0.0;
  this_01[1].def_material.kd = 4.0;
  this_01[1].def_material.ks = 1.0;
  this_01[1].def_material.kr = 1.0;
  this_02 = (GeometricObject *)operator_new(200);
  GeometricObject::GeometricObject(this_02);
  this_02->_vptr_GeometricObject = (_func_int **)&PTR__GeometricObject_00108c18;
  this_02[1]._vptr_GeometricObject = (_func_int **)0x4008000000000000;
  this_02[1].def_material.ka = 0.0;
  this_02[1].def_material.kd = 4.0;
  this_02[1].def_material.ks = 1.0;
  this_02[1].def_material.kr = 1.0;
  this_03 = (GeometricObject *)operator_new(0xc0);
  GeometricObject::GeometricObject(this_03);
  local_80 = (vector<std::shared_ptr<LightSource>,std::allocator<std::shared_ptr<LightSource>>> *)
             &this->light;
  this_03->_vptr_GeometricObject = (_func_int **)&PTR__GeometricObject_00108bd0;
  local_78 = 0;
  uStack_74 = 0;
  uStack_70 = 0;
  uStack_6c = 0x3ff00000;
  *(undefined4 *)&this_03[1]._vptr_GeometricObject = 0;
  *(undefined4 *)((long)&this_03[1]._vptr_GeometricObject + 4) = 0;
  *(undefined4 *)&this_03[1].def_material.ka = 0;
  *(undefined4 *)((long)&this_03[1].def_material.ka + 4) = 0x3ff00000;
  *(undefined4 *)&this_03[1].def_material.kd = 0;
  *(undefined4 *)((long)&this_03[1].def_material.kd + 4) = 0;
  *(undefined4 *)&this_03[1].def_material.ks = 0;
  *(undefined4 *)((long)&this_03[1].def_material.ks + 4) = 0x3ff00000;
  (this_00->def_material).ka = 0.2;
  (this_00->def_material).kd = 0.5;
  (this_00->def_material).ks = 0.6;
  (this_00->def_material).kr = 0.0;
  (this_00->def_material).kt = 0.0;
  (this_00->def_material).p = 0x1e;
  (this_00->def_material).color.x = 1.0;
  (this_00->def_material).color.y = 1.0;
  (this_00->def_material).color.z = 0.0;
  dVar1 = Grayzer::Medium::glass.beta;
  (this_00->def_material).med.ior = Grayzer::Medium::glass.ior;
  (this_00->def_material).med.beta = dVar1;
  (this_01->def_material).kt = (this_00->def_material).kt;
  (this_01->def_material).ks = (this_00->def_material).ks;
  (this_01->def_material).kr = (this_00->def_material).kr;
  dVar1 = (this_00->def_material).kd;
  (this_01->def_material).ka = (this_00->def_material).ka;
  (this_01->def_material).kd = dVar1;
  (this_01->def_material).p = (this_00->def_material).p;
  dVar1 = (this_00->def_material).med.beta;
  (this_01->def_material).med.ior = (this_00->def_material).med.ior;
  (this_01->def_material).med.beta = dVar1;
  (this_01->def_material).color.x = 1.0;
  (this_01->def_material).color.y = 0.0;
  (this_01->def_material).color.z = 0.0;
  (this_02->def_material).kt = (this_00->def_material).kt;
  dVar1 = (this_00->def_material).ka;
  dVar2 = (this_00->def_material).kd;
  dVar3 = (this_00->def_material).kr;
  (this_02->def_material).ks = (this_00->def_material).ks;
  (this_02->def_material).kr = dVar3;
  (this_02->def_material).ka = dVar1;
  (this_02->def_material).kd = dVar2;
  dVar1 = (this_00->def_material).med.beta;
  (this_02->def_material).med.ior = (this_00->def_material).med.ior;
  (this_02->def_material).med.beta = dVar1;
  (this_02->def_material).p = (this_00->def_material).p;
  (this_02->def_material).color.x = 0.0;
  (this_02->def_material).color.y = 0.0;
  (this_02->def_material).color.z = 1.0;
  (this_03->def_material).kt = (this_00->def_material).kt;
  dVar1 = (this_00->def_material).ka;
  dVar2 = (this_00->def_material).kd;
  dVar3 = (this_00->def_material).kr;
  (this_03->def_material).ks = (this_00->def_material).ks;
  (this_03->def_material).kr = dVar3;
  (this_03->def_material).ka = dVar1;
  (this_03->def_material).kd = dVar2;
  dVar1 = (this_00->def_material).med.beta;
  (this_03->def_material).med.ior = (this_00->def_material).med.ior;
  (this_03->def_material).med.beta = dVar1;
  (this_03->def_material).p = (this_00->def_material).p;
  dVar1 = (this_00->def_material).n.x;
  dVar2 = (this_00->def_material).n.y;
  (this_01->def_material).n.x = dVar1;
  (this_01->def_material).n.y = dVar2;
  (this_02->def_material).n.x = dVar1;
  (this_02->def_material).n.y = dVar2;
  (this_03->def_material).n.x = dVar1;
  (this_03->def_material).n.y = dVar2;
  dVar1 = (this_00->def_material).n.z;
  dVar2 = (this_00->def_material).map_coord.x;
  (this_01->def_material).n.z = dVar1;
  (this_01->def_material).map_coord.x = dVar2;
  (this_02->def_material).n.z = dVar1;
  (this_02->def_material).map_coord.x = dVar2;
  (this_03->def_material).n.z = dVar1;
  (this_03->def_material).map_coord.x = dVar2;
  dVar1 = (this_00->def_material).map_coord.y;
  dVar2 = (this_00->def_material).map_coord.z;
  (this_01->def_material).map_coord.y = dVar1;
  (this_01->def_material).map_coord.z = dVar2;
  (this_02->def_material).map_coord.y = dVar1;
  (this_02->def_material).map_coord.z = dVar2;
  (this_03->def_material).map_coord.y = dVar1;
  (this_03->def_material).map_coord.z = dVar2;
  (this_03->def_material).ka = 0.1;
  (this_03->def_material).kd = 0.5;
  (this_03->def_material).ks = 0.4;
  (this_03->def_material).kr = 0.4;
  (this_03->def_material).color.x = 0.0;
  (this_03->def_material).color.y = 0.0;
  (this_03->def_material).color.z = 1.0;
  (this_00->def_material).kr = 0.3;
  puVar4 = (undefined8 *)operator_new(0x40);
  puVar4[1] = 0x3ff0000000000000;
  puVar4[2] = 0x3ff0000000000000;
  *puVar4 = &PTR__LightSource_00108c60;
  puVar4[3] = 0x3ff0000000000000;
  puVar4[4] = 0x4024000000000000;
  puVar4[5] = 0x4014000000000000;
  puVar4[6] = 0xc024000000000000;
  puVar4[7] = 0x4031000000000000;
  this_04 = &this->solid;
  local_98.x = (double)this_00;
  std::vector<std::shared_ptr<GeometricObject>,std::allocator<std::shared_ptr<GeometricObject>>>::
  emplace_back<GeometricObject*&>
            ((vector<std::shared_ptr<GeometricObject>,std::allocator<std::shared_ptr<GeometricObject>>>
              *)this_04,(GeometricObject **)&local_98);
  local_98.x = (double)this_01;
  std::vector<std::shared_ptr<GeometricObject>,std::allocator<std::shared_ptr<GeometricObject>>>::
  emplace_back<GeometricObject*&>
            ((vector<std::shared_ptr<GeometricObject>,std::allocator<std::shared_ptr<GeometricObject>>>
              *)this_04,(GeometricObject **)&local_98);
  local_98.x = (double)this_02;
  std::vector<std::shared_ptr<GeometricObject>,std::allocator<std::shared_ptr<GeometricObject>>>::
  emplace_back<GeometricObject*&>
            ((vector<std::shared_ptr<GeometricObject>,std::allocator<std::shared_ptr<GeometricObject>>>
              *)this_04,(GeometricObject **)&local_98);
  local_98.x = (double)this_03;
  std::vector<std::shared_ptr<GeometricObject>,std::allocator<std::shared_ptr<GeometricObject>>>::
  emplace_back<GeometricObject*&>
            ((vector<std::shared_ptr<GeometricObject>,std::allocator<std::shared_ptr<GeometricObject>>>
              *)this_04,(GeometricObject **)&local_98);
  local_98.x = (double)puVar4;
  std::vector<std::shared_ptr<LightSource>,std::allocator<std::shared_ptr<LightSource>>>::
  emplace_back<LightSource*&>(local_80,(LightSource **)&local_98);
  (this->background).x = 0.196078;
  (this->background).y = 0.6;
  (this->background).z = 0.8;
  local_98.z = 0.0;
  local_98.x = 0.0;
  local_98.y = 0.0;
  local_48.x = 0.0;
  local_48.y = 0.0;
  local_48.z = 1.0;
  local_68.x = (double)CONCAT44(uStack_74,local_78);
  local_68.y = (double)CONCAT44(uStack_6c,uStack_70);
  local_68.z = 0.0;
  Scene::setCamera(this,&local_98,&local_48,&local_68);
  render_scene(this,1.5,1.0,300,200,"SAMPLE30.TGA");
  distributed_render_scene(this,1.5,1.0,300,200,5,5,"SAMPLE31.TGA");
  return 0;
}

Assistant:

int main()
{
    Sphere *s1,*s2,*s3;
    Plane *p;
    PointLight *Light1;

    Scene* scene = new Scene();
    s1 = new Sphere(Vector(0,1,5),1.5);
    s2 = new Sphere(Vector(-3,0,4),1);
    s3 = new Sphere(Vector(3,0,4),1);
    p = new Plane(Vector(0,1,0),1);
    s1->ambient(0.2);
    s1->diffuse(0.5);
    s1->specular(0.6);
    s1->reflection(0.0);
    s1->transmittance(0.0);
    s1->phong_size(30);
    s1->color(Yellow);
    s1->medium(Grayzer::Medium::glass);

    s2->surface_data(s1->surface_data());
    s2->color(Red);

    s3->surface_data(s1->surface_data());
    s3->color(Blue);

    p->surface_data(s1->surface_data());
    p->ambient(0.1);
    p->diffuse(0.5);
    p->specular(0.4);
    p->reflection(0.4);
    p->color(Blue);

    s1->reflection(0.3);

    Light1 = new PointLight(Vector(10,5,-10),17);
    scene->add(s1);
    scene->add(s2);
    scene->add(s3);
    scene->add(p);
    scene->add(Light1);
    scene->setBackground(SkyBlue);
    scene->setCamera(Vector(0),Vector(0,0,1),Vector(0,1,0));
    render_scene(scene, 1.5,1.0,300,200,"SAMPLE30.TGA");
    distributed_render_scene(scene, 1.5,1.0,300,200,5,5,"SAMPLE31.TGA");
}